

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O2

void av1_build_compound_diffwtd_mask_highbd_c
               (uint8_t *mask,DIFFWTD_MASK_TYPE mask_type,uint8_t *src0,int src0_stride,
               uint8_t *src1,int src1_stride,int h,int w,int bd)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  int i;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  undefined7 in_register_00000031;
  long lVar7;
  uint8_t uVar8;
  ushort uVar9;
  int j;
  ulong uVar10;
  ushort uVar11;
  int iVar12;
  
  iVar6 = (int)CONCAT71(in_register_00000031,mask_type);
  if (iVar6 == 1) {
    lVar3 = (long)src0 * 2;
    lVar7 = (long)src1 * 2;
    if (bd == 8) {
      uVar1 = w;
      if (w < 1) {
        uVar1 = 0;
      }
      if (h < 1) {
        h = 0;
      }
      for (iVar6 = 0; iVar6 != h; iVar6 = iVar6 + 1) {
        for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
          iVar12 = (uint)*(ushort *)(lVar3 + uVar10 * 2) - (uint)*(ushort *)(lVar7 + uVar10 * 2);
          uVar11 = (ushort)iVar12;
          uVar9 = -uVar11;
          if (0 < iVar12) {
            uVar9 = uVar11;
          }
          uVar11 = (uVar9 >> 4) + 0x26;
          uVar8 = '@' - (char)uVar11;
          if (0x40 < uVar11) {
            uVar8 = '\0';
          }
          mask[uVar10] = uVar8;
        }
        mask = mask + w;
        lVar3 = lVar3 + (long)src0_stride * 2;
        lVar7 = lVar7 + (long)src1_stride * 2;
      }
    }
    else {
      iVar6 = 0;
      uVar1 = w;
      if (w < 1) {
        uVar1 = 0;
      }
      if (h < 1) {
        h = 0;
      }
      for (; iVar6 != h; iVar6 = iVar6 + 1) {
        for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
          iVar12 = (uint)*(ushort *)(lVar3 + uVar10 * 2) - (uint)*(ushort *)(lVar7 + uVar10 * 2);
          uVar11 = (ushort)iVar12;
          uVar9 = -uVar11;
          if (0 < iVar12) {
            uVar9 = uVar11;
          }
          uVar11 = ((uVar9 >> ((char)bd - 8U & 0x1f)) >> 4) + 0x26;
          uVar8 = '\0';
          if (uVar11 < 0x41) {
            uVar8 = '@' - (char)uVar11;
          }
          mask[uVar10] = uVar8;
        }
        mask = mask + w;
        lVar3 = lVar3 + (long)src0_stride * 2;
        lVar7 = lVar7 + (long)src1_stride * 2;
      }
    }
  }
  else if (iVar6 == 0) {
    lVar3 = (long)src0 * 2;
    lVar7 = (long)src1 * 2;
    if (bd == 8) {
      iVar6 = 0;
      uVar1 = w;
      if (w < 1) {
        uVar1 = 0;
      }
      if (h < 1) {
        h = 0;
      }
      for (; iVar6 != h; iVar6 = iVar6 + 1) {
        for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
          uVar4 = (uint)*(ushort *)(lVar3 + uVar10 * 2) - (uint)*(ushort *)(lVar7 + uVar10 * 2);
          uVar2 = -uVar4;
          if (0 < (int)uVar4) {
            uVar2 = uVar4;
          }
          uVar5 = ((ulong)uVar2 & 0xffff) >> 4;
          if (0x19 < (uint)uVar5) {
            uVar5 = 0x1a;
          }
          mask[uVar10] = (char)uVar5 + '&';
        }
        mask = mask + w;
        lVar3 = lVar3 + (long)src0_stride * 2;
        lVar7 = lVar7 + (long)src1_stride * 2;
      }
    }
    else {
      iVar6 = 0;
      uVar1 = w;
      if (w < 1) {
        uVar1 = 0;
      }
      if (h < 1) {
        h = 0;
      }
      for (; iVar6 != h; iVar6 = iVar6 + 1) {
        for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
          iVar12 = (uint)*(ushort *)(lVar3 + uVar10 * 2) - (uint)*(ushort *)(lVar7 + uVar10 * 2);
          uVar11 = (ushort)iVar12;
          uVar9 = -uVar11;
          if (0 < iVar12) {
            uVar9 = uVar11;
          }
          uVar11 = (uVar9 >> ((char)bd - 8U & 0x1f)) >> 4;
          if (0x19 < uVar11) {
            uVar11 = 0x1a;
          }
          mask[uVar10] = (char)uVar11 + '&';
        }
        mask = mask + w;
        lVar3 = lVar3 + (long)src0_stride * 2;
        lVar7 = lVar7 + (long)src1_stride * 2;
      }
    }
  }
  return;
}

Assistant:

void av1_build_compound_diffwtd_mask_highbd_c(
    uint8_t *mask, DIFFWTD_MASK_TYPE mask_type, const uint8_t *src0,
    int src0_stride, const uint8_t *src1, int src1_stride, int h, int w,
    int bd) {
  switch (mask_type) {
    case DIFFWTD_38:
      diffwtd_mask_highbd(mask, 0, 38, CONVERT_TO_SHORTPTR(src0), src0_stride,
                          CONVERT_TO_SHORTPTR(src1), src1_stride, h, w, bd);
      break;
    case DIFFWTD_38_INV:
      diffwtd_mask_highbd(mask, 1, 38, CONVERT_TO_SHORTPTR(src0), src0_stride,
                          CONVERT_TO_SHORTPTR(src1), src1_stride, h, w, bd);
      break;
    default: assert(0);
  }
}